

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ColorEdit4(char *label,float *col,ImGuiColorEditFlags flags)

{
  ImVec2 IVar1;
  undefined8 *puVar2;
  bool bVar3;
  int v;
  int v_00;
  uint uVar4;
  uint uVar5;
  ImU32 IVar6;
  char *pcVar7;
  ImGuiPayload *pIVar8;
  ImGuiPayload *pIVar9;
  uint in_EDX;
  float *in_RSI;
  char *in_RDI;
  ImGuiPayload *payload_1;
  ImGuiPayload *payload;
  bool accepted_drag_drop;
  int n_1;
  ImGuiColorEditFlags picker_flags;
  ImGuiColorEditFlags picker_flags_to_forward;
  ImVec4 col_v4;
  float button_offset_x;
  ImGuiWindow *picker_active_window;
  int r;
  char *p;
  char buf [64];
  int n;
  int fmt_idx;
  bool hide_prefix;
  float w_item_last;
  float w_item_one;
  float inputs_offset_x;
  ImVec2 pos;
  bool value_changed_as_float;
  bool value_changed;
  int i [4];
  float f [4];
  int components;
  bool hdr;
  bool alpha;
  ImGuiColorEditFlags flags_untouched;
  char *label_display_end;
  float w_inputs;
  float w_button;
  float w_full;
  float square_sz;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  float *in_stack_000002b0;
  ImGuiColorEditFlags in_stack_000002bc;
  float *in_stack_000002c0;
  char *in_stack_000002c8;
  int in_stack_fffffffffffffdd8;
  ImGuiSliderFlags in_stack_fffffffffffffddc;
  float in_stack_fffffffffffffde0;
  float in_stack_fffffffffffffde4;
  ImVec2 *in_stack_fffffffffffffde8;
  float in_stack_fffffffffffffdf0;
  float in_stack_fffffffffffffdf4;
  float in_stack_fffffffffffffdf8;
  float fVar10;
  float in_stack_fffffffffffffdfc;
  float in_stack_fffffffffffffe00;
  float in_stack_fffffffffffffe04;
  float in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  float *in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  uint in_stack_fffffffffffffe2c;
  uint in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  float local_1b0;
  float local_1a0;
  float flags_00;
  float *type;
  float local_18c;
  bool local_171;
  ImVec4 local_170;
  int local_160;
  uint local_15c;
  ImGuiColorEditFlags in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  ImVec2 local_134;
  ImVec4 local_12c;
  ImVec2 local_11c;
  float local_114;
  ImGuiWindow *local_110;
  undefined4 local_104;
  undefined8 in_stack_ffffffffffffff00;
  ImGuiTextFlags flags_01;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  int local_b4;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float fVar11;
  float _y;
  undefined2 in_stack_ffffffffffffff74;
  byte bVar12;
  byte bVar13;
  int local_80;
  int local_7c;
  float local_78 [7];
  int local_5c;
  bool local_56;
  bool local_55;
  uint local_54;
  char *local_50;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  float local_1c;
  float *local_18;
  char *local_10;
  bool local_1;
  
  local_1c = (float)in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    local_3c = GetFrameHeight();
    local_40 = CalcItemWidth();
    if (((uint)local_1c & 0x10) == 0) {
      local_18c = local_3c + (local_38->ItemInnerSpacing).x;
    }
    else {
      local_18c = 0.0;
    }
    local_44 = local_18c;
    local_48 = local_40 - local_18c;
    local_50 = FindRenderedTextEnd(local_10,(char *)0x0);
    ImGuiNextItemData::ClearFlags(&local_30->NextItemData);
    BeginGroup();
    PushID((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_54 = (uint)local_1c;
    if (((uint)local_1c & 0x20) != 0) {
      local_1c = (float)((uint)local_1c & 0xff8fffff | 0x100008);
    }
    if (((uint)local_1c & 8) == 0) {
      ColorEditOptionsPopup
                ((float *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
    }
    if (((uint)local_1c & 0x700000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x700000U | (uint)local_1c);
    }
    if (((uint)local_1c & 0x1800000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x1800000U | (uint)local_1c);
    }
    if (((uint)local_1c & 0x6000000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x6000000U | (uint)local_1c);
    }
    if (((uint)local_1c & 0x18000000) == 0) {
      local_1c = (float)(local_30->ColorEditOptions & 0x18000000U | (uint)local_1c);
    }
    fVar11 = local_1c;
    local_1c = (float)(local_30->ColorEditOptions & 0xe00fffffU | (uint)local_1c);
    local_55 = ((uint)local_1c & 2) == 0;
    local_56 = ((uint)local_1c & 0x80000) != 0;
    local_5c = 3;
    if (local_55) {
      local_5c = 4;
    }
    local_78[0] = *local_18;
    local_78[1] = local_18[1];
    local_78[2] = local_18[2];
    type = local_78 + 3;
    if (local_55) {
      flags_00 = local_18[3];
    }
    else {
      flags_00 = 1.0;
    }
    local_78[3] = flags_00;
    if ((((uint)fVar11 & 0x10000000) == 0) || (((uint)fVar11 & 0x100000) == 0)) {
      if ((((uint)fVar11 & 0x8000000) != 0) && (((uint)fVar11 & 0x200000) != 0)) {
        ColorConvertRGBtoHSV
                  (in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                   (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   &in_stack_fffffffffffffde8->x,
                   (float *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        ColorEditRestoreHS(in_stack_fffffffffffffe10,
                           (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                           (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      }
    }
    else {
      ColorConvertHSVtoRGB
                ((float)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                 SUB84(in_stack_fffffffffffffe20,0),in_stack_fffffffffffffe1c,
                 in_stack_fffffffffffffe10,
                 (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
    }
    flags_01 = (ImGuiTextFlags)((ulong)in_stack_ffffffffffffff00 >> 0x20);
    v = (int)(local_78[0] * 255.0 +
             (float)(~-(uint)(0.0 <= local_78[0]) & 0xbf000000 |
                    -(uint)(0.0 <= local_78[0]) & 0x3f000000));
    v_00 = (int)(local_78[1] * 255.0 +
                (float)(~-(uint)(0.0 <= local_78[1]) & 0xbf000000 |
                       -(uint)(0.0 <= local_78[1]) & 0x3f000000));
    local_80 = (int)(local_78[2] * 255.0 +
                    (float)(~-(uint)(0.0 <= local_78[2]) & 0xbf000000 |
                           -(uint)(0.0 <= local_78[2]) & 0x3f000000));
    local_7c = (int)(local_78[3] * 255.0 +
                    (float)(~-(uint)(0.0 <= local_78[3]) & 0xbf000000 |
                           -(uint)(0.0 <= local_78[3]) & 0x3f000000));
    bVar13 = 0;
    bVar12 = 0;
    IVar1 = (local_28->DC).CursorPos;
    fVar11 = IVar1.x;
    _y = IVar1.y;
    if (local_38->ColorButtonPosition == 0) {
      local_1a0 = local_44;
    }
    else {
      local_1a0 = 0.0;
    }
    (local_28->DC).CursorPos.x = fVar11 + local_1a0;
    if ((((uint)local_1c & 0x300000) == 0) || (((uint)local_1c & 0x20) != 0)) {
      if ((((uint)local_1c & 0x400000) != 0) && (((uint)local_1c & 0x20) == 0)) {
        if ((local_55 & 1U) == 0) {
          in_stack_fffffffffffffe10 = (float *)&stack0xffffffffffffff08;
          uVar4 = ImClamp<int>(v,0,0xff);
          in_stack_fffffffffffffe1c = (float)ImClamp<int>(v_00,0,0xff);
          uVar5 = ImClamp<int>(local_80,0,0xff);
          ImFormatString((char *)in_stack_fffffffffffffe10,0x40,"#%02X%02X%02X",(ulong)uVar4,
                         (ulong)(uint)in_stack_fffffffffffffe1c,(ulong)uVar5);
        }
        else {
          in_stack_fffffffffffffe20 = &stack0xffffffffffffff08;
          in_stack_fffffffffffffe2c = ImClamp<int>(v,0,0xff);
          in_stack_fffffffffffffe30 = ImClamp<int>(v_00,0,0xff);
          in_stack_fffffffffffffe34 = ImClamp<int>(local_80,0,0xff);
          in_stack_fffffffffffffdd8 = ImClamp<int>(local_7c,0,0xff);
          ImFormatString(in_stack_fffffffffffffe20,0x40,"#%02X%02X%02X%02X",
                         (ulong)in_stack_fffffffffffffe2c,(ulong)in_stack_fffffffffffffe30,
                         (ulong)in_stack_fffffffffffffe34);
        }
        SetNextItemWidth(local_48);
        bVar3 = InputText((char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                          (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                          (size_t)in_stack_fffffffffffffe20,
                          (ImGuiInputTextFlags)in_stack_fffffffffffffe1c,
                          (ImGuiInputTextCallback)in_stack_fffffffffffffe10,
                          (void *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        if (bVar3) {
          bVar13 = 1;
          pcVar7 = &stack0xffffffffffffff08;
          while( true ) {
            in_stack_fffffffffffffe0c = CONCAT13(1,(int3)in_stack_fffffffffffffe0c);
            if (*pcVar7 != '#') {
              bVar3 = ImCharIsBlankA(*pcVar7);
              in_stack_fffffffffffffe0c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe0c);
            }
            if ((char)((uint)in_stack_fffffffffffffe0c >> 0x18) == '\0') break;
            pcVar7 = pcVar7 + 1;
          }
          local_80 = 0;
          v_00 = 0;
          v = 0;
          local_7c = 0xff;
          if ((local_55 & 1U) == 0) {
            local_104 = __isoc99_sscanf(pcVar7,"%02X%02X%02X",&stack0xffffffffffffff78,
                                        &stack0xffffffffffffff7c,&local_80);
            flags_01 = (ImGuiTextFlags)((ulong)pcVar7 >> 0x20);
          }
          else {
            local_104 = __isoc99_sscanf(pcVar7,"%02X%02X%02X%02X",&stack0xffffffffffffff78,
                                        &stack0xffffffffffffff7c,&local_80,&local_7c);
            flags_01 = (ImGuiTextFlags)((ulong)pcVar7 >> 0x20);
          }
        }
        if (((uint)local_1c & 8) == 0) {
          OpenPopupOnItemClick
                    ((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (ImGuiPopupFlags)in_stack_fffffffffffffdfc);
        }
      }
    }
    else {
      in_stack_ffffffffffffff64 =
           ImMax<float>(1.0,(float)(int)((local_48 -
                                         (local_38->ItemInnerSpacing).x * (float)(local_5c + -1)) /
                                        (float)local_5c));
      in_stack_ffffffffffffff60 =
           ImMax<float>(1.0,(float)(int)(local_48 -
                                        (in_stack_ffffffffffffff64 + (local_38->ItemInnerSpacing).x)
                                        * (float)(local_5c + -1)));
      CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   SUB41((uint)in_stack_fffffffffffffdfc >> 0x18,0),in_stack_fffffffffffffdf8);
      for (local_b4 = 0; flags_01 = (ImGuiTextFlags)((ulong)in_stack_ffffffffffffff00 >> 0x20),
          local_b4 < local_5c; local_b4 = local_b4 + 1) {
        if (0 < local_b4) {
          SameLine(0.0,(local_38->ItemInnerSpacing).x);
        }
        local_1b0 = in_stack_ffffffffffffff60;
        if (local_b4 + 1 < local_5c) {
          local_1b0 = in_stack_ffffffffffffff64;
        }
        SetNextItemWidth(local_1b0);
        fVar10 = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
        if (((uint)local_1c & 0x1000000) == 0) {
          bVar3 = DragInt((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (int *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                          in_stack_fffffffffffffdf4,(int)in_stack_fffffffffffffdf0,(int)fVar10,
                          (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                          in_stack_fffffffffffffddc);
          bVar13 = (bVar13 & 1) != 0 || bVar3;
        }
        else {
          bVar3 = DragFloat((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                            (float *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                            in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,fVar10,
                            (char *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            in_stack_fffffffffffffddc);
          bVar13 = (bVar13 & 1) != 0 || bVar3;
          bVar12 = (bVar12 & 1) != 0 || (bool)bVar13;
        }
        if (((uint)local_1c & 8) == 0) {
          OpenPopupOnItemClick
                    ((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                     (ImGuiPopupFlags)in_stack_fffffffffffffdfc);
        }
      }
    }
    local_110 = (ImGuiWindow *)0x0;
    if (((uint)local_1c & 0x10) == 0) {
      if ((((uint)local_1c & 0x20) == 0) && (local_38->ColorButtonPosition != 0)) {
        in_stack_fffffffffffffe08 = local_48 + (local_38->ItemInnerSpacing).x;
      }
      else {
        in_stack_fffffffffffffe08 = 0.0;
      }
      local_114 = in_stack_fffffffffffffe08;
      ImVec2::ImVec2(&local_11c,fVar11 + in_stack_fffffffffffffe08,_y);
      (local_28->DC).CursorPos = local_11c;
      in_stack_fffffffffffffdfc = *local_18;
      in_stack_fffffffffffffe00 = local_18[1];
      in_stack_fffffffffffffe04 = local_18[2];
      if ((local_55 & 1U) == 0) {
        fVar10 = 1.0;
      }
      else {
        fVar10 = local_18[3];
      }
      ImVec4::ImVec4(&local_12c,in_stack_fffffffffffffdfc,in_stack_fffffffffffffe00,
                     in_stack_fffffffffffffe04,fVar10);
      in_stack_fffffffffffffdf4 = local_1c;
      ImVec2::ImVec2(&local_134,0.0,0.0);
      bVar3 = ColorButton((char *)CONCAT44(v_00,v),
                          (ImVec4 *)
                          CONCAT17(bVar13,CONCAT16(bVar12,CONCAT24(in_stack_ffffffffffffff74,_y))),
                          (ImGuiColorEditFlags)fVar11,
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if ((bVar3) && (((uint)local_1c & 4) == 0)) {
        (local_30->ColorPickerRef).x = local_12c.x;
        (local_30->ColorPickerRef).y = local_12c.y;
        (local_30->ColorPickerRef).z = local_12c.z;
        (local_30->ColorPickerRef).w = local_12c.w;
        OpenPopup((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                  (ImGuiPopupFlags)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        ImRect::GetBL((ImRect *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        in_stack_fffffffffffffde8 = (ImVec2 *)&stack0xfffffffffffffeb4;
        ImVec2::ImVec2(in_stack_fffffffffffffde8,0.0,(local_38->ItemSpacing).y);
        ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                    (ImVec2 *)0x51377e);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeac,0.0,0.0);
        SetNextWindowPos((ImVec2 *)&stack0xfffffffffffffec4,0,(ImVec2 *)&stack0xfffffffffffffeac);
      }
      if (((uint)local_1c & 8) == 0) {
        OpenPopupOnItemClick
                  ((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   (ImGuiPopupFlags)in_stack_fffffffffffffdfc);
      }
      bVar3 = BeginPopup((char *)in_stack_fffffffffffffde8,
                         (ImGuiWindowFlags)in_stack_fffffffffffffde4);
      if (bVar3) {
        if (local_30->CurrentWindow->BeginCount == 1) {
          local_110 = local_30->CurrentWindow;
          if (local_10 != local_50) {
            TextEx(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,flags_01);
            Spacing();
          }
          local_15c = local_54 & 0x1f890002 | 0x740080;
          SetNextItemWidth(local_3c * 12.0);
          bVar3 = ColorPicker4(in_stack_000002c8,in_stack_000002c0,in_stack_000002bc,
                               in_stack_000002b0);
          bVar13 = (bVar13 & 1) != 0 || bVar3;
        }
        EndPopup();
      }
    }
    if ((local_10 != local_50) && (((uint)local_1c & 0x80) == 0)) {
      in_stack_fffffffffffffde4 = fVar11;
      SameLine(0.0,(local_38->ItemInnerSpacing).x);
      in_stack_fffffffffffffde0 = local_44;
      if (((uint)local_1c & 0x20) == 0) {
        in_stack_fffffffffffffde0 = local_40 + (local_38->ItemInnerSpacing).x;
      }
      (local_28->DC).CursorPos.x = in_stack_fffffffffffffde4 + in_stack_fffffffffffffde0;
      TextEx(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,flags_01);
    }
    if (((bVar13 & 1) != 0) && (local_110 == (ImGuiWindow *)0x0)) {
      if ((bVar12 & 1) == 0) {
        for (local_160 = 0; local_160 < 4; local_160 = local_160 + 1) {
          local_78[local_160] = (float)(int)local_78[(long)local_160 + -4] / 255.0;
        }
      }
      if ((((uint)local_1c & 0x200000) != 0) && (((uint)local_1c & 0x8000000) != 0)) {
        local_30->ColorEditLastHue = local_78[0];
        local_30->ColorEditLastSat = local_78[1];
        ColorConvertHSVtoRGB
                  ((float)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                   SUB84(in_stack_fffffffffffffe20,0),in_stack_fffffffffffffe1c,
                   in_stack_fffffffffffffe10,
                   (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (float *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
        ImVec4::ImVec4(&local_170,local_78[0],local_78[1],local_78[2],0.0);
        IVar6 = ColorConvertFloat4ToU32
                          ((ImVec4 *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
        local_30->ColorEditLastColor = IVar6;
      }
      if ((((uint)local_1c & 0x100000) != 0) && (((uint)local_1c & 0x10000000) != 0)) {
        ColorConvertRGBtoHSV
                  (in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                   (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   &in_stack_fffffffffffffde8->x,
                   (float *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      }
      *local_18 = local_78[0];
      local_18[1] = local_78[1];
      local_18[2] = local_78[2];
      if ((local_55 & 1U) != 0) {
        local_18[3] = local_78[3];
      }
    }
    PopID();
    EndGroup();
    if (((((local_30->LastItemData).StatusFlags & 1U) != 0) && (((uint)local_1c & 0x200) == 0)) &&
       (bVar3 = BeginDragDropTarget(), bVar3)) {
      pIVar8 = AcceptDragDropPayload((char *)type,(ImGuiDragDropFlags)flags_00);
      if (pIVar8 != (ImGuiPayload *)0x0) {
        puVar2 = (undefined8 *)pIVar8->Data;
        *(undefined8 *)local_18 = *puVar2;
        local_18[2] = *(float *)(puVar2 + 1);
        bVar13 = 1;
      }
      pIVar9 = AcceptDragDropPayload((char *)type,(ImGuiDragDropFlags)flags_00);
      if (pIVar9 != (ImGuiPayload *)0x0) {
        memcpy(local_18,pIVar9->Data,(long)local_5c << 2);
        bVar13 = 1;
      }
      local_171 = pIVar9 != (ImGuiPayload *)0x0 || pIVar8 != (ImGuiPayload *)0x0;
      if ((local_171) && (((uint)local_1c & 0x10000000) != 0)) {
        ColorConvertRGBtoHSV
                  (in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                   (float *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                   &in_stack_fffffffffffffde8->x,
                   (float *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      }
      EndDragDropTarget();
    }
    if (((local_110 != (ImGuiWindow *)0x0) && (local_30->ActiveId != 0)) &&
       (local_30->ActiveIdWindow == local_110)) {
      (local_30->LastItemData).ID = local_30->ActiveId;
    }
    if (((bVar13 & 1) != 0) && ((local_30->LastItemData).ID != 0)) {
      MarkItemEdited((local_30->LastItemData).ID);
    }
    local_1 = (bool)(bVar13 & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ColorEdit4(const char* label, float col[4], ImGuiColorEditFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float square_sz = GetFrameHeight();
    const float w_full = CalcItemWidth();
    const float w_button = (flags & ImGuiColorEditFlags_NoSmallPreview) ? 0.0f : (square_sz + style.ItemInnerSpacing.x);
    const float w_inputs = w_full - w_button;
    const char* label_display_end = FindRenderedTextEnd(label);
    g.NextItemData.ClearFlags();

    BeginGroup();
    PushID(label);

    // If we're not showing any slider there's no point in doing any HSV conversions
    const ImGuiColorEditFlags flags_untouched = flags;
    if (flags & ImGuiColorEditFlags_NoInputs)
        flags = (flags & (~ImGuiColorEditFlags_DisplayMask_)) | ImGuiColorEditFlags_DisplayRGB | ImGuiColorEditFlags_NoOptions;

    // Context menu: display and modify options (before defaults are applied)
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorEditOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_DisplayMask_))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_DisplayMask_);
    if (!(flags & ImGuiColorEditFlags_DataTypeMask_))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_DataTypeMask_);
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_);
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_InputMask_);
    flags |= (g.ColorEditOptions & ~(ImGuiColorEditFlags_DisplayMask_ | ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_PickerMask_ | ImGuiColorEditFlags_InputMask_));
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_DisplayMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));   // Check that only 1 is selected

    const bool alpha = (flags & ImGuiColorEditFlags_NoAlpha) == 0;
    const bool hdr = (flags & ImGuiColorEditFlags_HDR) != 0;
    const int components = alpha ? 4 : 3;

    // Convert to the formats we need
    float f[4] = { col[0], col[1], col[2], alpha ? col[3] : 1.0f };
    if ((flags & ImGuiColorEditFlags_InputHSV) && (flags & ImGuiColorEditFlags_DisplayRGB))
        ColorConvertHSVtoRGB(f[0], f[1], f[2], f[0], f[1], f[2]);
    else if ((flags & ImGuiColorEditFlags_InputRGB) && (flags & ImGuiColorEditFlags_DisplayHSV))
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(f[0], f[1], f[2], f[0], f[1], f[2]);
        ColorEditRestoreHS(col, &f[0], &f[1], &f[2]);
    }
    int i[4] = { IM_F32_TO_INT8_UNBOUND(f[0]), IM_F32_TO_INT8_UNBOUND(f[1]), IM_F32_TO_INT8_UNBOUND(f[2]), IM_F32_TO_INT8_UNBOUND(f[3]) };

    bool value_changed = false;
    bool value_changed_as_float = false;

    const ImVec2 pos = window->DC.CursorPos;
    const float inputs_offset_x = (style.ColorButtonPosition == ImGuiDir_Left) ? w_button : 0.0f;
    window->DC.CursorPos.x = pos.x + inputs_offset_x;

    if ((flags & (ImGuiColorEditFlags_DisplayRGB | ImGuiColorEditFlags_DisplayHSV)) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB/HSV 0..255 Sliders
        const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_inputs - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
        const float w_item_last = ImMax(1.0f, IM_FLOOR(w_inputs - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));

        const bool hide_prefix = (w_item_one <= CalcTextSize((flags & ImGuiColorEditFlags_Float) ? "M:0.000" : "M:000").x);
        static const char* ids[4] = { "##X", "##Y", "##Z", "##W" };
        static const char* fmt_table_int[3][4] =
        {
            {   "%3d",   "%3d",   "%3d",   "%3d" }, // Short display
            { "R:%3d", "G:%3d", "B:%3d", "A:%3d" }, // Long display for RGBA
            { "H:%3d", "S:%3d", "V:%3d", "A:%3d" }  // Long display for HSVA
        };
        static const char* fmt_table_float[3][4] =
        {
            {   "%0.3f",   "%0.3f",   "%0.3f",   "%0.3f" }, // Short display
            { "R:%0.3f", "G:%0.3f", "B:%0.3f", "A:%0.3f" }, // Long display for RGBA
            { "H:%0.3f", "S:%0.3f", "V:%0.3f", "A:%0.3f" }  // Long display for HSVA
        };
        const int fmt_idx = hide_prefix ? 0 : (flags & ImGuiColorEditFlags_DisplayHSV) ? 2 : 1;

        for (int n = 0; n < components; n++)
        {
            if (n > 0)
                SameLine(0, style.ItemInnerSpacing.x);
            SetNextItemWidth((n + 1 < components) ? w_item_one : w_item_last);

            // FIXME: When ImGuiColorEditFlags_HDR flag is passed HS values snap in weird ways when SV values go below 0.
            if (flags & ImGuiColorEditFlags_Float)
            {
                value_changed |= DragFloat(ids[n], &f[n], 1.0f / 255.0f, 0.0f, hdr ? 0.0f : 1.0f, fmt_table_float[fmt_idx][n]);
                value_changed_as_float |= value_changed;
            }
            else
            {
                value_changed |= DragInt(ids[n], &i[n], 1.0f, 0, hdr ? 0 : 255, fmt_table_int[fmt_idx][n]);
            }
            if (!(flags & ImGuiColorEditFlags_NoOptions))
                OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
        }
    }
    else if ((flags & ImGuiColorEditFlags_DisplayHex) != 0 && (flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        // RGB Hexadecimal Input
        char buf[64];
        if (alpha)
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X%02X", ImClamp(i[0], 0, 255), ImClamp(i[1], 0, 255), ImClamp(i[2], 0, 255), ImClamp(i[3], 0, 255));
        else
            ImFormatString(buf, IM_ARRAYSIZE(buf), "#%02X%02X%02X", ImClamp(i[0], 0, 255), ImClamp(i[1], 0, 255), ImClamp(i[2], 0, 255));
        SetNextItemWidth(w_inputs);
        if (InputText("##Text", buf, IM_ARRAYSIZE(buf), ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsUppercase))
        {
            value_changed = true;
            char* p = buf;
            while (*p == '#' || ImCharIsBlankA(*p))
                p++;
            i[0] = i[1] = i[2] = 0;
            i[3] = 0xFF; // alpha default to 255 is not parsed by scanf (e.g. inputting #FFFFFF omitting alpha)
            int r;
            if (alpha)
                r = sscanf(p, "%02X%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2], (unsigned int*)&i[3]); // Treat at unsigned (%X is unsigned)
            else
                r = sscanf(p, "%02X%02X%02X", (unsigned int*)&i[0], (unsigned int*)&i[1], (unsigned int*)&i[2]);
            IM_UNUSED(r); // Fixes C6031: Return value ignored: 'sscanf'.
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
    }

    ImGuiWindow* picker_active_window = NULL;
    if (!(flags & ImGuiColorEditFlags_NoSmallPreview))
    {
        const float button_offset_x = ((flags & ImGuiColorEditFlags_NoInputs) || (style.ColorButtonPosition == ImGuiDir_Left)) ? 0.0f : w_inputs + style.ItemInnerSpacing.x;
        window->DC.CursorPos = ImVec2(pos.x + button_offset_x, pos.y);

        const ImVec4 col_v4(col[0], col[1], col[2], alpha ? col[3] : 1.0f);
        if (ColorButton("##ColorButton", col_v4, flags))
        {
            if (!(flags & ImGuiColorEditFlags_NoPicker))
            {
                // Store current color and open a picker
                g.ColorPickerRef = col_v4;
                OpenPopup("picker");
                SetNextWindowPos(g.LastItemData.Rect.GetBL() + ImVec2(0.0f, style.ItemSpacing.y));
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);

        if (BeginPopup("picker"))
        {
            if (g.CurrentWindow->BeginCount == 1)
            {
                picker_active_window = g.CurrentWindow;
                if (label != label_display_end)
                {
                    TextEx(label, label_display_end);
                    Spacing();
                }
                ImGuiColorEditFlags picker_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_PickerMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaBar;
                ImGuiColorEditFlags picker_flags = (flags_untouched & picker_flags_to_forward) | ImGuiColorEditFlags_DisplayMask_ | ImGuiColorEditFlags_NoLabel | ImGuiColorEditFlags_AlphaPreviewHalf;
                SetNextItemWidth(square_sz * 12.0f); // Use 256 + bar sizes?
                value_changed |= ColorPicker4("##picker", col, picker_flags, &g.ColorPickerRef.x);
            }
            EndPopup();
        }
    }

    if (label != label_display_end && !(flags & ImGuiColorEditFlags_NoLabel))
    {
        // Position not necessarily next to last submitted button (e.g. if style.ColorButtonPosition == ImGuiDir_Left),
        // but we need to use SameLine() to setup baseline correctly. Might want to refactor SameLine() to simplify this.
        SameLine(0.0f, style.ItemInnerSpacing.x);
        window->DC.CursorPos.x = pos.x + ((flags & ImGuiColorEditFlags_NoInputs) ? w_button : w_full + style.ItemInnerSpacing.x);
        TextEx(label, label_display_end);
    }

    // Convert back
    if (value_changed && picker_active_window == NULL)
    {
        if (!value_changed_as_float)
            for (int n = 0; n < 4; n++)
                f[n] = i[n] / 255.0f;
        if ((flags & ImGuiColorEditFlags_DisplayHSV) && (flags & ImGuiColorEditFlags_InputRGB))
        {
            g.ColorEditLastHue = f[0];
            g.ColorEditLastSat = f[1];
            ColorConvertHSVtoRGB(f[0], f[1], f[2], f[0], f[1], f[2]);
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(f[0], f[1], f[2], 0));
        }
        if ((flags & ImGuiColorEditFlags_DisplayRGB) && (flags & ImGuiColorEditFlags_InputHSV))
            ColorConvertRGBtoHSV(f[0], f[1], f[2], f[0], f[1], f[2]);

        col[0] = f[0];
        col[1] = f[1];
        col[2] = f[2];
        if (alpha)
            col[3] = f[3];
    }

    PopID();
    EndGroup();

    // Drag and Drop Target
    // NB: The flag test is merely an optional micro-optimization, BeginDragDropTarget() does the same test.
    if ((g.LastItemData.StatusFlags & ImGuiItemStatusFlags_HoveredRect) && !(flags & ImGuiColorEditFlags_NoDragDrop) && BeginDragDropTarget())
    {
        bool accepted_drag_drop = false;
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_3F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * 3); // Preserve alpha if any //-V512 //-V1086
            value_changed = accepted_drag_drop = true;
        }
        if (const ImGuiPayload* payload = AcceptDragDropPayload(IMGUI_PAYLOAD_TYPE_COLOR_4F))
        {
            memcpy((float*)col, payload->Data, sizeof(float) * components);
            value_changed = accepted_drag_drop = true;
        }

        // Drag-drop payloads are always RGB
        if (accepted_drag_drop && (flags & ImGuiColorEditFlags_InputHSV))
            ColorConvertRGBtoHSV(col[0], col[1], col[2], col[0], col[1], col[2]);
        EndDragDropTarget();
    }

    // When picker is being actively used, use its active id so IsItemActive() will function on ColorEdit4().
    if (picker_active_window && g.ActiveId != 0 && g.ActiveIdWindow == picker_active_window)
        g.LastItemData.ID = g.ActiveId;

    if (value_changed && g.LastItemData.ID != 0) // In case of ID collision, the second EndGroup() won't catch g.ActiveId
        MarkItemEdited(g.LastItemData.ID);

    return value_changed;
}